

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum.cpp
# Opt level: O2

void Timidity::convert_sample_data(Sample *sp,void *data)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  sample_t *psVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  SBYTE *cp;
  
  iVar6 = sp->data_length;
  iVar7 = iVar6 >> 1;
  switch(sp->modes & 3) {
  case 0:
    psVar9 = (sample_t *)safe_malloc((long)iVar6 * 4 + 4);
    uVar8 = sp->data_length;
    uVar10 = 0;
    uVar11 = 0;
    if (0 < (int)uVar8) {
      uVar11 = (ulong)uVar8;
    }
    for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
      psVar9[uVar10] =
           (float)(int)(char)*(byte *)((long)data + uVar10) *
           *(float *)(&DAT_005ae020 + (ulong)(*(byte *)((long)data + uVar10) >> 7) * 4);
    }
    break;
  case 1:
    sp->data_length = iVar7;
    uVar2 = sp->loop_start;
    uVar4 = sp->loop_end;
    sp->loop_start = (int)uVar2 >> 1;
    sp->loop_end = (int)uVar4 >> 1;
    psVar9 = (sample_t *)safe_malloc((long)iVar7 * 4 + 4);
    uVar8 = sp->data_length;
    uVar10 = 0;
    uVar11 = 0;
    if (0 < (int)uVar8) {
      uVar11 = (ulong)uVar8;
    }
    for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
      uVar12 = (uint)*(short *)((long)data + uVar10 * 2);
      psVar9[uVar10] = (float)(int)uVar12 * *(float *)(&DAT_005ae010 + (uVar12 >> 0xd & 4));
    }
    break;
  case 2:
    psVar9 = (sample_t *)safe_malloc((long)iVar6 * 4 + 4);
    uVar8 = sp->data_length;
    uVar10 = 0;
    uVar11 = 0;
    if (0 < (int)uVar8) {
      uVar11 = (ulong)uVar8;
    }
    for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
      psVar9[uVar10] =
           (float)(int)(*(byte *)((long)data + uVar10) - 0x80) *
           *(float *)(&DAT_005ae018 + (ulong)(*(byte *)((long)data + uVar10) >> 7) * 4);
    }
    break;
  case 3:
    sp->data_length = iVar7;
    uVar1 = sp->loop_start;
    uVar3 = sp->loop_end;
    sp->loop_start = (int)uVar1 >> 1;
    sp->loop_end = (int)uVar3 >> 1;
    psVar9 = (sample_t *)safe_malloc((long)iVar7 * 4 + 4);
    uVar8 = sp->data_length;
    uVar10 = 0;
    uVar11 = 0;
    if (0 < (int)uVar8) {
      uVar11 = (ulong)uVar8;
    }
    for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
      uVar5 = *(ushort *)((long)data + uVar10 * 2);
      psVar9[uVar10] =
           (float)(int)(uVar5 - 0x8000) * *(float *)(&DAT_005ae008 + (ulong)(uVar5 >> 0xf) * 4);
    }
  }
  psVar9[(int)uVar8] = psVar9[(long)(int)uVar8 + -1];
  free(sp->data);
  sp->data = psVar9;
  return;
}

Assistant:

void convert_sample_data(Sample *sp, const void *data)
{
	/* convert everything to 32-bit floating point data */
	sample_t *newdata = NULL;

	switch (sp->modes & (PATCH_16 | PATCH_UNSIGNED))
	{
	case 0:
	  {					/* 8-bit, signed */
		SBYTE *cp = (SBYTE *)data;
		newdata = (sample_t *)safe_malloc((sp->data_length + 1) * sizeof(sample_t));
		for (int i = 0; i < sp->data_length; ++i)
		{
			if (cp[i] < 0)
			{
				newdata[i] = float(cp[i]) / 128.f;
			}
			else
			{
				newdata[i] = float(cp[i]) / 127.f;
			}
		}
		break;
	  }

	case PATCH_UNSIGNED:
	  {					/* 8-bit, unsigned */
		BYTE *cp = (BYTE *)data;
		newdata = (sample_t *)safe_malloc((sp->data_length + 1) * sizeof(sample_t));
		for (int i = 0; i < sp->data_length; ++i)
		{
			int c = cp[i] - 128;
			if (c < 0)
			{
				newdata[i] = float(c) / 128.f;
			}
			else
			{
				newdata[i] = float(c) / 127.f;
			}
		}
		break;
	  }

	case PATCH_16:
	  {					/* 16-bit, signed */
		SWORD *cp = (SWORD *)data;
		/* Convert these to samples */
		sp->data_length >>= 1;
		sp->loop_start >>= 1;
		sp->loop_end >>= 1;
		newdata = (sample_t *)safe_malloc((sp->data_length + 1) * sizeof(sample_t));
		for (int i = 0; i < sp->data_length; ++i)
		{
			int c = LittleShort(cp[i]);
			if (c < 0)
			{
				newdata[i] = float(c) / 32768.f;
			}
			else
			{
				newdata[i] = float(c) / 32767.f;
			}
		}
		break;
	  }

	case PATCH_16 | PATCH_UNSIGNED:
	  {					/* 16-bit, unsigned */
		WORD *cp = (WORD *)data;
		/* Convert these to samples */
		sp->data_length >>= 1;
		sp->loop_start >>= 1;
		sp->loop_end >>= 1;
		newdata = (sample_t *)safe_malloc((sp->data_length + 1) * sizeof(sample_t));
		for (int i = 0; i < sp->data_length; ++i)
		{
			int c = LittleShort(cp[i]) - 32768;
			if (c < 0)
			{
				newdata[i] = float(c) / 32768.f;
			}
			else
			{
				newdata[i] = float(c) / 32767.f;
			}
		}
		break;
	  }
	}
	/* Duplicate the final sample for linear interpolation. */
	newdata[sp->data_length] = newdata[sp->data_length - 1];
	if (sp->data != NULL)
	{
		free(sp->data);
	}
	sp->data = newdata;
}